

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CmdLineParser.h
# Opt level: O2

bool __thiscall
axl::sl::CmdLineParser<CmdLineParser,_CmdLineSwitchTable>::processSwitch
          (CmdLineParser<CmdLineParser,_CmdLineSwitchTable> *this,SwitchInfo *switchInfo,
          StringRef *switchName,StringRef *value)

{
  bool bVar1;
  EVP_PKEY_CTX *src;
  
  bVar1 = checkMissingValue(this);
  if (bVar1) {
    if ((switchInfo->m_value == (char *)0x0) || (value->m_length != 0)) {
      bVar1 = CmdLineParser::onSwitch((CmdLineParser *)this,switchInfo->m_switchKind,value);
      return bVar1;
    }
    (this->super_CmdLineParserRoot).m_valueSwitchKind = switchInfo->m_switchKind;
    StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
              (&(this->super_CmdLineParserRoot).m_valueSwitchName,(EVP_PKEY_CTX *)switchName,src);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
	processSwitch(
		const SwitchInfo* switchInfo,
		const sl::StringRef& switchName,
		const sl::StringRef& value
	) {
		bool result;

		T* self = static_cast<T*>(this);

		result = checkMissingValue();
		if (!result)
			return false;

		if (switchInfo->m_value && value.isEmpty()) {
			m_valueSwitchKind = switchInfo->m_switchKind;
			m_valueSwitchName = switchName;
			return true;
		}

		return self->onSwitch((SwitchKind)switchInfo->m_switchKind, value);
	}